

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeTextureApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::texsubimage2d_invalid_offset
               (NegativeTestContext *ctx)

{
  NegativeTestContext *this;
  allocator<char> local_39;
  string local_38;
  GLuint local_14;
  NegativeTestContext *pNStack_10;
  deUint32 texture;
  NegativeTestContext *ctx_local;
  
  local_14 = 0x1234;
  pNStack_10 = ctx;
  glu::CallLogWrapper::glGenTextures(&ctx->super_CallLogWrapper,1,&local_14);
  glu::CallLogWrapper::glBindTexture(&pNStack_10->super_CallLogWrapper,0xde1,local_14);
  glu::CallLogWrapper::glTexImage2D
            (&pNStack_10->super_CallLogWrapper,0xde1,0,0x1908,0x20,0x20,0,0x1908,0x1401,(void *)0x0)
  ;
  NegativeTestContext::expectError(pNStack_10,0);
  this = pNStack_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,
             "GL_INVALID_VALUE is generated if xoffset + width > texture_width or yoffset + height > texture_height."
             ,&local_39);
  NegativeTestContext::beginSection(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  glu::CallLogWrapper::glTexSubImage2D
            (&pNStack_10->super_CallLogWrapper,0xde1,0,0x1e,0,4,4,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501);
  glu::CallLogWrapper::glTexSubImage2D
            (&pNStack_10->super_CallLogWrapper,0xde1,0,0,0x1e,4,4,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501);
  glu::CallLogWrapper::glTexSubImage2D
            (&pNStack_10->super_CallLogWrapper,0xde1,0,0x1e,0x1e,4,4,0x1908,0x1401,(void *)0x0);
  NegativeTestContext::expectError(pNStack_10,0x501);
  NegativeTestContext::endSection(pNStack_10);
  glu::CallLogWrapper::glDeleteTextures(&pNStack_10->super_CallLogWrapper,1,&local_14);
  return;
}

Assistant:

void texsubimage2d_invalid_offset (NegativeTestContext& ctx)
{
	deUint32			texture = 0x1234;
	ctx.glGenTextures		(1, &texture);
	ctx.glBindTexture		(GL_TEXTURE_2D, texture);
	ctx.glTexImage2D		(GL_TEXTURE_2D, 0, GL_RGBA, 32, 32, 0, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError			(GL_NO_ERROR);

	ctx.beginSection("GL_INVALID_VALUE is generated if xoffset + width > texture_width or yoffset + height > texture_height.");
	ctx.glTexSubImage2D(GL_TEXTURE_2D, 0, 30, 0, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 30, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glTexSubImage2D(GL_TEXTURE_2D, 0, 30, 30, 4, 4, GL_RGBA, GL_UNSIGNED_BYTE, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.glDeleteTextures	(1, &texture);
}